

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_util.c
# Opt level: O1

int ExUtilGetInts(char *v,int base,int max_output,int *output)

{
  int iVar1;
  uint32_t uVar2;
  char *pcVar3;
  ulong uVar4;
  int error;
  int local_3c;
  int *local_38;
  
  local_3c = 0;
  uVar4 = 0;
  if (0 < max_output && v != (char *)0x0) {
    uVar4 = 0;
    local_38 = output;
    while( true ) {
      uVar2 = ExUtilGetUInt(v,base,&local_3c);
      iVar1 = local_3c;
      if (local_3c == 0) {
        local_38[uVar4] = uVar2;
        pcVar3 = strchr(v,0x2c);
        v = pcVar3 + 1;
        if (pcVar3 == (char *)0x0) {
          v = (char *)0x0;
        }
      }
      if (iVar1 != 0) break;
      uVar4 = uVar4 + 1;
      if ((v == (char *)0x0) || ((uint)max_output <= uVar4)) goto LAB_0010483b;
    }
    uVar4 = 0xffffffff;
  }
LAB_0010483b:
  return (int)uVar4;
}

Assistant:

int ExUtilGetInts(const char* v, int base, int max_output, int output[]) {
  int n, error = 0;
  for (n = 0; v != NULL && n < max_output; ++n) {
    const int value = ExUtilGetInt(v, base, &error);
    if (error) return -1;
    output[n] = value;
    v = strchr(v, ',');
    if (v != NULL) ++v;   // skip over the trailing ','
  }
  return n;
}